

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O2

reference __thiscall
absl::InlinedVector<int,_4UL,_std::allocator<int>_>::emplace_back<int>
          (InlinedVector<int,_4UL,_std::allocator<int>_> *this,int *args)

{
  ulong uVar1;
  reference piVar2;
  ulong uVar3;
  Rep *pRVar4;
  ulong uVar5;
  
  uVar1 = (this->allocator_and_tag_).tag_.size_;
  uVar3 = uVar1 >> 1;
  if ((uVar1 & 1) == 0) {
    uVar5 = 4;
  }
  else {
    uVar5 = *(ulong *)&this->rep_;
  }
  pRVar4 = &this->rep_;
  if (uVar5 < uVar3) {
    __assert_fail("s <= capacity()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                  ,0x217,
                  "reference absl::InlinedVector<int, 4>::emplace_back(Args &&...) [T = int, N = 4, A = std::allocator<int>, Args = <int>]"
                 );
  }
  if (uVar3 == uVar5) {
    piVar2 = GrowAndEmplaceBack<int>(this,args);
    return piVar2;
  }
  if (uVar3 < uVar5) {
    if ((uVar1 & 1) != 0) {
      pRVar4 = *(Rep **)((long)&this->rep_ + 8);
    }
    (this->allocator_and_tag_).tag_.size_ = uVar1 + 2;
    piVar2 = (reference)((long)pRVar4 + uVar3 * 4);
    *piVar2 = *args;
    return piVar2;
  }
  __assert_fail("s < capacity()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                ,0x21b,
                "reference absl::InlinedVector<int, 4>::emplace_back(Args &&...) [T = int, N = 4, A = std::allocator<int>, Args = <int>]"
               );
}

Assistant:

reference emplace_back(Args&&... args) {
    size_type s = size();
    assert(s <= capacity());
    if (ABSL_PREDICT_FALSE(s == capacity())) {
      return GrowAndEmplaceBack(std::forward<Args>(args)...);
    }
    assert(s < capacity());

    pointer space;
    if (allocated()) {
      tag().set_allocated_size(s + 1);
      space = allocated_space();
    } else {
      tag().set_inline_size(s + 1);
      space = inlined_space();
    }
    return Construct(space + s, std::forward<Args>(args)...);
  }